

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O2

void __thiscall irr::gui::CGUITabControl::clear(CGUITabControl *this)

{
  pointer ppIVar1;
  IGUIElement *child;
  IGUITab *pIVar2;
  u32 i;
  ulong uVar3;
  
  for (uVar3 = 0;
      ppIVar1 = (this->Tabs).m_data.
                super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar3 < ((ulong)((long)(this->Tabs).m_data.
                             super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3 &
              0xffffffff); uVar3 = uVar3 + 1) {
    child = &ppIVar1[uVar3]->super_IGUIElement;
    if (child != (IGUIElement *)0x0) {
      IGUIElement::removeChild((IGUIElement *)this,child);
      pIVar2 = (this->Tabs).m_data.
               super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar3];
      IReferenceCounted::drop
                ((IReferenceCounted *)
                 ((long)&(pIVar2->super_IGUIElement).super_IEventReceiver +
                 *(long *)(*(long *)&(pIVar2->super_IGUIElement).super_IEventReceiver + -0x18)));
    }
  }
  core::array<irr::gui::IGUITab_*>::clear(&this->Tabs);
  recalculateScrollBar(this);
  return;
}

Assistant:

void CGUITabControl::clear()
{
	for (u32 i = 0; i < Tabs.size(); ++i) {
		if (Tabs[i]) {
			IGUIElement::removeChild(Tabs[i]);
			Tabs[i]->drop();
		}
	}
	Tabs.clear();

	recalculateScrollBar();
}